

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

int __thiscall
glslang::TSymbolValidater::checkLocationOverlap
          (TSymbolValidater *this,TRange *locationRange,
          vector<glslang::TRange,_std::allocator<glslang::TRange>_> *usedUniformLocation,
          TString *symbolName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
          *usedUniformName,bool *diffLocation)

{
  pointer pTVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if ((usedUniformLocation->super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (usedUniformLocation->super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 0;
    lVar5 = 0;
    uVar4 = 0;
    do {
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)((long)&(((usedUniformName->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                    super_allocator_type.allocator + lVar3),symbolName);
      if (iVar2 == 0) {
        *diffLocation = true;
        pTVar1 = (usedUniformLocation->
                 super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = *(int *)((long)&pTVar1->start + lVar5);
        if ((iVar2 == locationRange->start) &&
           (*(int *)((long)&pTVar1->last + lVar5) == locationRange->last)) {
          return -2;
        }
        if (locationRange->start < iVar2) {
          locationRange = (TRange *)((long)&pTVar1->start + lVar5);
        }
LAB_00482e81:
        return locationRange->start;
      }
      pTVar1 = (usedUniformLocation->
               super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = *(int *)((long)&pTVar1->start + lVar5);
      if ((iVar2 <= locationRange->last) &&
         (locationRange->start <= *(int *)((long)&pTVar1->last + lVar5))) {
        if (locationRange->start < iVar2) {
          locationRange = (TRange *)((long)&pTVar1->start + lVar5);
        }
        goto LAB_00482e81;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 8;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < (ulong)((long)(usedUniformLocation->
                                   super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(usedUniformLocation->
                                   super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return -1;
}

Assistant:

int checkLocationOverlap(const TRange& locationRange, std::vector<TRange>& usedUniformLocation, const TString symbolName, std::vector<TString>& usedUniformName, bool& diffLocation)
    {
        for (size_t r = 0; r < usedUniformLocation.size(); ++r) {
            if (usedUniformName[r] == symbolName) {
                diffLocation = true;
                return (usedUniformLocation[r].start == locationRange.start &&
                        usedUniformLocation[r].last == locationRange.last)
                       ? -2 : std::max(locationRange.start, usedUniformLocation[r].start);
            }
            if (locationRange.overlap(usedUniformLocation[r])) {
                // there is a collision; pick one
                return std::max(locationRange.start, usedUniformLocation[r].start);
            }
        }

        return -1; // no collision
    }